

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_4c.h
# Opt level: O2

void __thiscall SAUF4C<UFPC>::PerformLabeling(SAUF4C<UFPC> *this)

{
  uint uVar1;
  int iVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  int r;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int local_9c;
  Size local_98;
  Mat local_90 [96];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
  uVar8 = *(uint *)&pMVar3->field_0x8;
  uVar1 = *(uint *)&pMVar3->field_0xc;
  local_98.height = (int)**(undefined8 **)&pMVar3->field_0x40;
  local_98.width = (int)((ulong)**(undefined8 **)&pMVar3->field_0x40 >> 0x20);
  local_9c = 0;
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98,&local_9c);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
  UFPC::Alloc((int)((long)*(int *)&pMVar3->field_0xc * (long)*(int *)&pMVar3->field_0x8 + 1U >> 1) +
              1);
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  uVar15 = 0;
  uVar14 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar14 = uVar15;
  }
  uVar17 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar17 = uVar15;
  }
  lVar12 = -1;
  for (; uVar15 != uVar17; uVar15 = uVar15 + 1) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_;
    lVar13 = *(long *)&pMVar3->field_0x10;
    lVar5 = **(long **)&pMVar3->field_0x48;
    lVar11 = *(long *)&pMVar4->field_0x10;
    lVar6 = **(long **)&pMVar4->field_0x48;
    lVar9 = lVar11 + lVar6 * uVar15;
    lVar18 = lVar9 + -4;
    lVar10 = lVar5 * uVar15 + lVar13;
    lVar11 = lVar6 * lVar12 + lVar11;
    for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
      if (*(char *)(lVar10 + uVar16) != '\0') {
        if ((uVar15 == 0) || (*(char *)(lVar5 * lVar12 + lVar13 + uVar16) == '\0')) {
          if ((uVar16 == 0) || (*(char *)(lVar10 + -1 + uVar16) == '\0')) {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar8 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
          }
          else {
            uVar8 = *(uint *)(lVar18 + uVar16 * 4);
          }
        }
        else if ((uVar16 == 0) || (*(char *)(lVar10 + -1 + uVar16) == '\0')) {
          uVar8 = *(uint *)(lVar11 + uVar16 * 4);
        }
        else {
          uVar8 = UFPC::Merge(*(uint *)(lVar11 + uVar16 * 4),*(uint *)(lVar18 + uVar16 * 4));
        }
        *(uint *)(lVar9 + uVar16 * 4) = uVar8;
      }
    }
    lVar12 = lVar12 + 1;
  }
  uVar8 = UFPC::Flatten();
  (this->super_Labeling2D<(Connectivity2D)4,_false>).n_labels_ = uVar8;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_;
  for (lVar12 = 0; puVar7 = UFPC::P_, lVar12 < *(int *)&pMVar4->field_0x8; lVar12 = lVar12 + 1) {
    lVar9 = **(long **)&pMVar4->field_0x48 * lVar12 + *(long *)&pMVar4->field_0x10;
    iVar2 = *(int *)&pMVar4->field_0xc;
    for (lVar13 = 0; (long)iVar2 * 4 != lVar13; lVar13 = lVar13 + 4) {
      *(uint *)(lVar9 + lVar13) = puVar7[*(uint *)(lVar9 + lVar13)];
    }
  }
  UFPC::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size(), 0); // Allocation + initialization of the output image

        LabelsSolver::Alloc(UPPER_BOUND_4_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_4 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_5 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c], img_labels_row[c - 1]); // x <- p + s

#include "labeling_sauf_4c_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned * img_row_start = img_labels_.ptr<unsigned>(r);
            unsigned * const img_row_end = img_row_start + img_labels_.cols;
            for (; img_row_start != img_row_end; ++img_row_start) {
                *img_row_start = LabelsSolver::GetLabel(*img_row_start);
            }
        }

        LabelsSolver::Dealloc(); // Memory deallocation of the labels solver

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }